

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

err_t botpHOTPVerify(char *otp,octet *key,size_t key_len,octet *ctr)

{
  bool_t bVar1;
  size_t sVar2;
  octet *state_00;
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  bool_t success;
  void *state;
  octet *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  octet *key_00;
  err_t local_4;
  
  bVar1 = strIsValid(in_stack_ffffffffffffffc0);
  if (((bVar1 == 0) || (sVar2 = strLen((char *)0x15a7c1), sVar2 < 6)) ||
     (sVar2 = strLen((char *)0x15a7d1), 8 < sVar2)) {
    local_4 = 0x206;
  }
  else {
    bVar1 = memIsValid(in_RSI,(size_t)in_RDX);
    if ((bVar1 == 0) || (bVar1 = memIsValid(in_RCX,8), bVar1 == 0)) {
      local_4 = 0x6d;
    }
    else {
      botpHOTP_keep();
      state_00 = (octet *)blobCreate((size_t)in_stack_ffffffffffffffb8);
      if (state_00 == (octet *)0x0) {
        local_4 = 0x6e;
      }
      else {
        key_00 = state_00;
        strLen((char *)0x15a851);
        botpHOTPStart(in_RDX,(size_t)in_RCX,key_00,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        botpHOTPStepS(state_00,in_stack_ffffffffffffffb8);
        bVar1 = botpHOTPStepV((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              state_00);
        blobClose((blob_t)0x15a894);
        local_4 = 0x206;
        if (bVar1 != 0) {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t botpHOTPVerify(const char* otp, const octet key[], size_t key_len, 
	const octet ctr[8])
{
	void* state;
	bool_t success;
	// проверить входные данные
	if (!strIsValid(otp) || strLen(otp) < 6 || strLen(otp) > 8)
		return ERR_BAD_PWD;
	if (!memIsValid(key, key_len) || !memIsValid(ctr, 8))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(botpHOTP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// проверить пароль
	botpHOTPStart(state, strLen(otp), key, key_len);
	botpHOTPStepS(state, ctr);
	success = botpHOTPStepV(otp, state);
	// завершить
	blobClose(state);
	return success ? ERR_OK : ERR_BAD_PWD;
}